

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Modulus_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  double value;
  
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    pvVar2 = TaggedInt::Modulus(aLeft,aRight,scriptContext);
    return pvVar2;
  }
  value = Modulus_Helper(aLeft,aRight,scriptContext);
  pvVar2 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Modulus_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Modulus_Full);
            // If both arguments are TaggedInt, then try to do integer modulus.
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Modulus(aLeft, aRight, scriptContext);
            }

            double remainder = Modulus_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::ToVarIntCheck(remainder, scriptContext);
            JIT_HELPER_END(Op_Modulus_Full);
        }